

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::RenderDeviceVkImpl::ExecuteAndDisposeTransientCmdBuff
          (RenderDeviceVkImpl *this,SoftwareQueueIndex CommandQueueId,VkCommandBuffer vkCmdBuff,
          CommandPoolWrapper *CmdPool)

{
  pthread_mutex_t *__mutex;
  CommandQueue *pCVar1;
  VkCommandPool_T *pVVar2;
  size_type sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  VkResult VVar6;
  int iVar7;
  uint Value;
  undefined4 extraout_var;
  ICommandQueueVk *pIVar8;
  iterator iVar9;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this_00;
  CommandPoolWrapper *Args_1;
  char (*in_R8) [2];
  ulong uVar10;
  HardwareQueueIndex QueueFamilyIndex;
  string msg;
  string msg_4;
  
  Args_1 = CmdPool;
  if (vkCmdBuff == (VkCommandBuffer)0x0) {
    FormatString<char[26],char[28]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"vkCmdBuff != VK_NULL_HANDLE",(char (*) [28])CmdPool);
    Args_1 = (CommandPoolWrapper *)0x128;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ExecuteAndDisposeTransientCmdBuff",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0x128);
    std::__cxx11::string::~string((string *)&msg);
  }
  VVar6 = (*vkEndCommandBuffer)(vkCmdBuff);
  if (VVar6 != VK_SUCCESS) {
    FormatString<char[29]>(&msg,(char (*) [29])"Failed to end command buffer");
    Args_1 = (CommandPoolWrapper *)0x12b;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ExecuteAndDisposeTransientCmdBuff",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,299);
    std::__cxx11::string::~string((string *)&msg);
  }
  uVar10 = (ulong)CommandQueueId.m_Value;
  if ((this->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).m_CmdQueueCount <= uVar10) {
    FormatString<char[26],char[27]>
              (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x5b55cc,
               (char (*) [27])Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"LockCmdQueueAndRun",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineNextGenBase/include/RenderDeviceNextGenBase.hpp"
               ,0x107);
    std::__cxx11::string::~string((string *)&msg);
  }
  pCVar1 = (this->
           super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ).m_CommandQueues;
  __mutex = (pthread_mutex_t *)(pCVar1 + uVar10);
  std::mutex::lock((mutex *)&__mutex->__data);
  pIVar8 = pCVar1[uVar10].CmdQueue.m_pObject;
  iVar7 = (*(pIVar8->super_ICommandQueue).super_IObject._vptr_IObject[7])(pIVar8,vkCmdBuff);
  pthread_mutex_unlock(__mutex);
  pIVar8 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
           ::GetCommandQueue(&this->
                              super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                             ,CommandQueueId);
  Value = (*(pIVar8->super_ICommandQueue).super_IObject._vptr_IObject[0xc])(pIVar8);
  IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag>::
  IndexWrapper<unsigned_int,unsigned_int>
            ((IndexWrapper<unsigned_char,Diligent::_HardwareQueueIndexTag> *)&QueueFamilyIndex,Value
            );
  iVar9 = std::
          _Hashtable<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_std::allocator<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>_>,_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>::Hasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->m_TransientCmdPoolMgrs)._M_h,(key_type *)&QueueFamilyIndex);
  if (iVar9.
      super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
      ._M_cur == (__node_type *)0x0) {
    msg_4._M_dataplus._M_p._0_4_ = (uint)QueueFamilyIndex.m_Value;
    FormatString<char[70],unsigned_int,char[2]>
              (&msg,(Diligent *)
                    "Unable to find transient command pool manager for queue family index ",
               (char (*) [70])&msg_4,(uint *)0x665ed2,in_R8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"ExecuteAndDisposeTransientCmdBuff",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0x185);
    std::__cxx11::string::~string((string *)&msg);
  }
  this_00 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ::GetReleaseQueue(&this->
                               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                              ,CommandQueueId);
  msg._M_dataplus._M_p =
       (pointer)(this->m_LogicalVkDevice).
                super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
  msg._M_string_length =
       (long)iVar9.
             super__Node_iterator_base<std::pair<const_Diligent::IndexWrapper<unsigned_char,_Diligent::_HardwareQueueIndexTag>,_Diligent::CommandPoolManager>,_false>
             ._M_cur + 0x10;
  msg.field_2._M_allocated_capacity =
       (size_type)
       (CmdPool->m_pLogicalDevice).
       super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  msg.field_2._8_8_ =
       (CmdPool->m_pLogicalDevice).
       super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (CmdPool->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (CmdPool->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  pVVar2 = CmdPool->m_VkObject;
  CmdPool->m_VkObject = (VkCommandPool_T *)0x0;
  if (vkCmdBuff == (VkCommandBuffer)0x0 || pVVar2 == (VkCommandPool_T *)0x0) {
    FormatString<char[26],char[56]>
              (&msg_4,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Pool != VK_NULL_HANDLE && vkCmdBuffer != VK_NULL_HANDLE",
               (char (*) [56])CmdPool);
    DebugAssertionFailed
              (msg_4._M_dataplus._M_p,"TransientCmdPoolRecycler",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderDeviceVkImpl.cpp"
               ,0x15d);
    std::__cxx11::string::~string((string *)&msg_4);
  }
  msg_4._M_dataplus._M_p = (pointer)::operator_new(0x38);
  uVar5 = msg.field_2._8_8_;
  uVar4 = msg.field_2._M_allocated_capacity;
  sVar3 = msg._M_string_length;
  msg.field_2._8_8_ = 0;
  msg.field_2._M_allocated_capacity = 0;
  *(undefined ***)msg_4._M_dataplus._M_p = &PTR__SpecificStaleResource_00895bc8;
  msg._M_string_length = 0;
  *(pointer *)(msg_4._M_dataplus._M_p + 8) = msg._M_dataplus._M_p;
  *(size_type *)(msg_4._M_dataplus._M_p + 0x10) = sVar3;
  *(undefined8 *)(msg_4._M_dataplus._M_p + 0x18) = uVar4;
  *(undefined8 *)(msg_4._M_dataplus._M_p + 0x20) = uVar5;
  *(VkCommandPool_T **)(msg_4._M_dataplus._M_p + 0x28) = pVVar2;
  *(VkCommandBuffer *)(msg_4._M_dataplus._M_p + 0x30) = vkCmdBuff;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::DiscardResource
            (this_00,(DynamicStaleResourceWrapper *)&msg_4,CONCAT44(extraout_var,iVar7));
  DynamicStaleResourceWrapper::~DynamicStaleResourceWrapper((DynamicStaleResourceWrapper *)&msg_4);
  ExecuteAndDisposeTransientCmdBuff::TransientCmdPoolRecycler::~TransientCmdPoolRecycler
            ((TransientCmdPoolRecycler *)&msg);
  return;
}

Assistant:

void RenderDeviceVkImpl::ExecuteAndDisposeTransientCmdBuff(SoftwareQueueIndex                    CommandQueueId,
                                                           VkCommandBuffer                       vkCmdBuff,
                                                           VulkanUtilities::CommandPoolWrapper&& CmdPool)
{
    VERIFY_EXPR(vkCmdBuff != VK_NULL_HANDLE);

    VkResult err = vkEndCommandBuffer(vkCmdBuff);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to end command buffer");
    (void)err;

    // We MUST NOT discard stale objects when executing transient command buffer,
    // otherwise a resource can be destroyed while still being used by the GPU:
    //
    //
    // Next Cmd Buff| Next Fence |        Immediate Context               |            This thread               |
    //              |            |                                        |                                      |
    //      N       |     F      |                                        |                                      |
    //              |            |  Draw(ResourceX)                       |                                      |
    //      N  -  - | -   -   -  |  Release(ResourceX)                    |                                      |
    //              |            |  - {N, ResourceX} -> Stale Objects     |                                      |
    //              |            |                                        |                                      |
    //              |            |                                        | SubmitCommandBuffer()                |
    //              |            |                                        | - SubmittedCmdBuffNumber = N         |
    //              |            |                                        | - SubmittedFenceValue = F            |
    //     N+1      |    F+1     |                                        | - DiscardStaleVkObjects(N, F)        |
    //              |            |                                        |   - {F, ResourceX} -> Release Queue  |
    //              |            |                                        |                                      |
    //     N+2 -   -|  - F+2  -  |  ExecuteCommandBuffer()                |                                      |
    //              |            |  - SubmitCommandBuffer()               |                                      |
    //              |            |  - ResourceX is already in release     |                                      |
    //              |            |    queue with fence value F, and       |                                      |
    //              |            |    F < SubmittedFenceValue==F+1        |                                      |
    //
    // Since transient command buffers do not count as real command buffers, submit them directly to the queue
    // to avoid interference with the command buffer counter
    Uint64 FenceValue = 0;
    LockCmdQueueAndRun(CommandQueueId,
                       [&](ICommandQueueVk* pCmdQueueVk) //
                       {
                           FenceValue = pCmdQueueVk->SubmitCmdBuffer(vkCmdBuff);
                       } //
    );

    class TransientCmdPoolRecycler
    {
    public:
        TransientCmdPoolRecycler(const VulkanUtilities::VulkanLogicalDevice& _LogicalDevice,
                                 CommandPoolManager&                         _CmdPoolMgr,
                                 VulkanUtilities::CommandPoolWrapper&&       _Pool,
                                 VkCommandBuffer&&                           _vkCmdBuffer) :
            // clang-format off
            LogicalDevice{_LogicalDevice         },
            CmdPoolMgr   {&_CmdPoolMgr           },
            Pool         {std::move(_Pool)       },
            vkCmdBuffer  {std::move(_vkCmdBuffer)}
        // clang-format on
        {
            VERIFY_EXPR(Pool != VK_NULL_HANDLE && vkCmdBuffer != VK_NULL_HANDLE);
            _vkCmdBuffer = VK_NULL_HANDLE;
        }

        // clang-format off
        TransientCmdPoolRecycler             (const TransientCmdPoolRecycler&)  = delete;
        TransientCmdPoolRecycler& operator = (const TransientCmdPoolRecycler&)  = delete;
        TransientCmdPoolRecycler& operator = (      TransientCmdPoolRecycler&&) = delete;

        TransientCmdPoolRecycler(TransientCmdPoolRecycler&& rhs) noexcept :
            LogicalDevice{rhs.LogicalDevice         },
            CmdPoolMgr   {rhs.CmdPoolMgr            },
            Pool         {std::move(rhs.Pool)       },
            vkCmdBuffer  {std::move(rhs.vkCmdBuffer)}
        {
            rhs.CmdPoolMgr  = nullptr;
            rhs.vkCmdBuffer = VK_NULL_HANDLE;
        }
        // clang-format on

        ~TransientCmdPoolRecycler()
        {
            if (CmdPoolMgr != nullptr)
            {
                LogicalDevice.FreeCommandBuffer(Pool, vkCmdBuffer);
                CmdPoolMgr->RecycleCommandPool(std::move(Pool));
            }
        }

    private:
        const VulkanUtilities::VulkanLogicalDevice& LogicalDevice;

        CommandPoolManager*                 CmdPoolMgr = nullptr;
        VulkanUtilities::CommandPoolWrapper Pool;
        VkCommandBuffer                     vkCmdBuffer = VK_NULL_HANDLE;
    };

    HardwareQueueIndex QueueFamilyIndex{GetCommandQueue(CommandQueueId).GetQueueFamilyIndex()};
    auto               CmdPoolMgrIter = m_TransientCmdPoolMgrs.find(QueueFamilyIndex);
    VERIFY(CmdPoolMgrIter != m_TransientCmdPoolMgrs.end(),
           "Unable to find transient command pool manager for queue family index ", Uint32{QueueFamilyIndex}, ".");

    // Discard command pool directly to the release queue since we know exactly which queue it was submitted to
    // as well as the associated FenceValue
    // clang-format off
    GetReleaseQueue(CommandQueueId).DiscardResource(
        TransientCmdPoolRecycler
        {
            GetLogicalDevice(),
            CmdPoolMgrIter->second,
            std::move(CmdPool),
            std::move(vkCmdBuff)
        },
        FenceValue);
    // clang-format on
}